

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O0

base_learner * topk_setup(options_i *options,vw *all)

{
  byte bVar1;
  typed_option<unsigned_int> *this;
  pointer ptVar2;
  base_learner *this_00;
  learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *this_01;
  vw *in_RSI;
  long *in_RDI;
  learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  option_group_definition new_options;
  free_ptr<topk> data;
  typed_option<unsigned_int> *in_stack_fffffffffffffd38;
  vw *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  single_learner *in_stack_fffffffffffffd50;
  typed_option<unsigned_int> *op;
  allocator local_249;
  string local_248 [39];
  undefined1 local_221 [40];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<unsigned_int> local_1d8;
  learner<char,_char> *in_stack_ffffffffffffff00;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [72];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<topk>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Top K",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd40,
             (string *)in_stack_fffffffffffffd38);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"top",&local_1f9);
  std::unique_ptr<topk,_void_(*)(void_*)>::operator->
            ((unique_ptr<topk,_void_(*)(void_*)> *)0x2def4c);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffd48,(uint *)in_stack_fffffffffffffd40)
  ;
  this = VW::config::typed_option<unsigned_int>::keep(&local_1d8,true);
  op = (typed_option<unsigned_int> *)local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_221 + 1),"top k recommendation",(allocator *)op);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd40,
             (string *)in_stack_fffffffffffffd38);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  VW::config::option_group_definition::add<unsigned_int>((option_group_definition *)this,op);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd40);
  std::__cxx11::string::~string((string *)(local_221 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_221);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd40);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (**(code **)*local_10)(local_10,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"top",&local_249);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    ptVar2 = std::unique_ptr<topk,_void_(*)(void_*)>::operator->
                       ((unique_ptr<topk,_void_(*)(void_*)> *)0x2df28f);
    ptVar2->all = local_18;
    this_00 = setup_base((options_i *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    in_stack_fffffffffffffd50 = LEARNER::as_singleline<char,char>(in_stack_ffffffffffffff00);
    this_01 = LEARNER::
              init_learner<topk,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,example>>
                        ((free_ptr<topk> *)in_stack_fffffffffffffd50,
                         (learner<char,_example> *)in_stack_fffffffffffffd48,
                         (_func_void_topk_ptr_learner<char,_example>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                          *)in_stack_fffffffffffffd40,
                         (_func_void_topk_ptr_learner<char,_example>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                          *)in_stack_fffffffffffffd38);
    LEARNER::learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish_example
              (this_01,finish_example);
    LEARNER::learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish
              ((learner<topk,_std::vector<example_*,_std::allocator<example_*>_>_> *)this_00,
               (_func_void_topk_ptr *)local_18);
    in_stack_fffffffffffffd40 =
         (vw *)LEARNER::make_base<topk,std::vector<example*,std::allocator<example*>>>(this_01);
    local_8 = in_stack_fffffffffffffd40;
  }
  else {
    local_8 = (vw *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd40);
  std::unique_ptr<topk,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<topk,_void_(*)(void_*)> *)in_stack_fffffffffffffd50);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* topk_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<topk>();

  option_group_definition new_options("Top K");
  new_options.add(make_option("top", data->K).keep().help("top k recommendation"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("top"))
    return nullptr;

  data->all = &all;

  LEARNER::learner<topk, multi_ex>& l =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}